

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertical.cpp
# Opt level: O2

void __thiscall
cppurses::layout::Vertical::distribute_space
          (Vertical *this,
          vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          *widgets,int height_left)

{
  size_t sVar1;
  Type TVar2;
  pointer pDVar3;
  ulong uVar4;
  int iVar5;
  Dimensions_reference *d;
  pointer pDVar6;
  _Elt_pointer puVar7;
  iterator __end3;
  int iVar8;
  int iVar9;
  pointer pDVar10;
  ulong uVar11;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *__range2;
  _Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *this_00;
  Dimensions_reference *d_1;
  long lVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *__range2_1;
  ulong local_d8;
  Vertical *local_d0;
  double local_c8;
  double dStack_c0;
  deque<unsigned_long,_std::allocator<unsigned_long>_> height_additions;
  _Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  local_60;
  _Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  local_48;
  
  lVar12 = 0;
  for (pDVar6 = (widgets->
                super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pDVar6 != (widgets->
                super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                )._M_impl.super__Vector_impl_data._M_finish; pDVar6 = pDVar6 + 1) {
    if (((pDVar6->widget->height_policy).type_ & ~Minimum) == Expanding) {
      lVar12 = lVar12 + (pDVar6->widget->height_policy).stretch_;
    }
  }
  local_d0 = this;
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_Deque_base
            (&height_additions.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>);
  auVar14._8_4_ = (int)((ulong)lVar12 >> 0x20);
  auVar14._0_8_ = lVar12;
  auVar14._12_4_ = 0x45300000;
  dStack_c0 = auVar14._8_8_ - 1.9342813113834067e+25;
  pDVar3 = (widgets->
           super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_c8 = dStack_c0 + ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0);
  lVar12 = 0;
  for (pDVar6 = (widgets->
                super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                )._M_impl.super__Vector_impl_data._M_start; pDVar6 != pDVar3; pDVar6 = pDVar6 + 1) {
    if (((pDVar6->widget->height_policy).type_ & ~Minimum) == Expanding) {
      sVar1 = (pDVar6->widget->height_policy).stretch_;
      auVar15._0_8_ = (double)CONCAT44(0x43300000,(int)sVar1);
      auVar15._8_4_ = (int)(sVar1 >> 0x20);
      auVar15._12_4_ = 0x45300000;
      dVar18 = (((auVar15._8_8_ - 1.9342813113834067e+25) + (auVar15._0_8_ - 4503599627370496.0)) /
               local_c8) * (double)height_left;
      local_d8 = (ulong)dVar18;
      local_d8 = (long)(dVar18 - 9.223372036854776e+18) & (long)local_d8 >> 0x3f | local_d8;
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&height_additions,&local_d8);
      puVar7 = height_additions.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (height_additions.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur ==
          height_additions.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        puVar7 = height_additions.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      uVar11 = *pDVar6->height;
      uVar4 = (pDVar6->widget->height_policy).max_;
      if (uVar4 < puVar7[-1] + uVar11) {
        *pDVar6->height = uVar4;
        std::
        vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
        ::erase(widgets,(Dimensions_reference *)
                        ((long)(widgets->
                               super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                               )._M_impl.super__Vector_impl_data._M_start - lVar12));
        this_00 = &local_48;
        std::
        vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
        ::vector((vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                  *)this_00,widgets);
        distribute_space(local_d0,(vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                                   *)this_00,((int)uVar4 - (int)uVar11) + height_left);
        goto LAB_001591f5;
      }
    }
    lVar12 = lVar12 + -0x18;
  }
  pDVar3 = (widgets->
           super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pDVar6 = (widgets->
                super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                )._M_impl.super__Vector_impl_data._M_start; pDVar6 != pDVar3; pDVar6 = pDVar6 + 1) {
    if (((pDVar6->widget->height_policy).type_ & ~Minimum) == Expanding) {
      *pDVar6->height =
           *pDVar6->height +
           *height_additions.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
      height_left = height_left -
                    (int)*height_additions.
                          super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur;
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front(&height_additions);
    }
  }
  if (height_left != 0) {
    lVar12 = 0;
    for (pDVar6 = (widgets->
                  super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pDVar6 != (widgets->
                  super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                  )._M_impl.super__Vector_impl_data._M_finish; pDVar6 = pDVar6 + 1) {
      TVar2 = (pDVar6->widget->height_policy).type_;
      if ((TVar2 < (Ignored|Minimum)) && ((0x4aU >> (TVar2 & 0x1f) & 1) != 0)) {
        lVar12 = lVar12 + (pDVar6->widget->height_policy).stretch_;
      }
    }
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::clear(&height_additions);
    auVar16._8_4_ = (int)((ulong)lVar12 >> 0x20);
    auVar16._0_8_ = lVar12;
    auVar16._12_4_ = 0x45300000;
    dStack_c0 = auVar16._8_8_ - 1.9342813113834067e+25;
    local_c8 = dStack_c0 + ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0);
    pDVar3 = (widgets->
             super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    lVar12 = 0;
    for (pDVar6 = (widgets->
                  super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                  )._M_impl.super__Vector_impl_data._M_start; pDVar6 != pDVar3; pDVar6 = pDVar6 + 1)
    {
      TVar2 = (pDVar6->widget->height_policy).type_;
      if ((TVar2 < (Ignored|Minimum)) && ((0x4aU >> (TVar2 & 0x1f) & 1) != 0)) {
        sVar1 = (pDVar6->widget->width_policy).stretch_;
        auVar17._0_8_ = (double)CONCAT44(0x43300000,(int)sVar1);
        auVar17._8_4_ = (int)(sVar1 >> 0x20);
        auVar17._12_4_ = 0x45300000;
        dVar18 = (((auVar17._8_8_ - 1.9342813113834067e+25) + (auVar17._0_8_ - 4503599627370496.0))
                 / local_c8) * (double)height_left;
        local_d8 = (ulong)dVar18;
        local_d8 = (long)(dVar18 - 9.223372036854776e+18) & (long)local_d8 >> 0x3f | local_d8;
        std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  (&height_additions,&local_d8);
        puVar7 = height_additions.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (height_additions.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur ==
            height_additions.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_first) {
          puVar7 = height_additions.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        uVar11 = *pDVar6->height;
        uVar4 = (pDVar6->widget->height_policy).max_;
        if (uVar4 < puVar7[-1] + uVar11) {
          *pDVar6->height = uVar4;
          std::
          vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          ::erase(widgets,(Dimensions_reference *)
                          ((long)(widgets->
                                 super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                                 )._M_impl.super__Vector_impl_data._M_start - lVar12));
          this_00 = &local_60;
          std::
          vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          ::vector((vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                    *)this_00,widgets);
          distribute_space(local_d0,(vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                                     *)this_00,height_left + ((int)uVar11 - (int)uVar4));
LAB_001591f5:
          std::
          _Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          ::~_Vector_base(this_00);
          goto LAB_001591fd;
        }
      }
      lVar12 = lVar12 + -0x18;
    }
    pDVar3 = (widgets->
             super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pDVar6 = (widgets->
                  super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                  )._M_impl.super__Vector_impl_data._M_start; pDVar6 != pDVar3; pDVar6 = pDVar6 + 1)
    {
      TVar2 = (pDVar6->widget->height_policy).type_;
      if ((TVar2 < (Ignored|Minimum)) && ((0x4aU >> (TVar2 & 0x1f) & 1) != 0)) {
        *pDVar6->height =
             *pDVar6->height +
             *height_additions.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur;
        height_left = height_left -
                      (int)*height_additions.
                            super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                            .super__Deque_impl_data._M_start._M_cur;
        std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front(&height_additions);
      }
    }
    if (height_left != 0) {
      pDVar6 = (widgets->
               super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pDVar3 = (widgets->
               super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pDVar10 = pDVar6;
      iVar5 = height_left;
      do {
        for (; iVar9 = iVar5, pDVar10 != pDVar3; pDVar10 = pDVar10 + 1) {
          if ((((pDVar10->widget->height_policy).type_ & ~Minimum) == Expanding) &&
             (0 < height_left)) {
            uVar11 = *pDVar10->height + 1;
            if (uVar11 <= (pDVar10->widget->height_policy).max_) {
              *pDVar10->height = uVar11;
              height_left = height_left + -1;
            }
          }
          iVar5 = iVar9;
        }
        pDVar10 = pDVar6;
        iVar5 = height_left;
        iVar8 = iVar9;
      } while (iVar9 != height_left);
      do {
        for (; pDVar10 != pDVar3; pDVar10 = pDVar10 + 1) {
          TVar2 = (pDVar10->widget->height_policy).type_;
          if ((TVar2 == Ignored || (TVar2 & ~Maximum) == Minimum) && (0 < iVar9)) {
            uVar11 = *pDVar10->height + 1;
            if (uVar11 <= (pDVar10->widget->height_policy).max_) {
              *pDVar10->height = uVar11;
              iVar9 = iVar9 + -1;
            }
          }
        }
        bVar13 = iVar8 != iVar9;
        pDVar10 = pDVar6;
        iVar8 = iVar9;
      } while (bVar13);
    }
  }
LAB_001591fd:
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
            (&height_additions.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void Vertical::distribute_space(std::vector<Dimensions_reference> widgets,
                                int height_left) {
    // Find total stretch of first group
    std::size_t total_stretch{0};
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->height_policy.type();
        if (policy == Size_policy::Expanding ||
            policy == Size_policy::MinimumExpanding) {
            total_stretch += d.widget->height_policy.stretch();
        }
    }

    // Calculate new heights of widgets in new group, if any go over max_height
    // then assign max value and recurse without that widget in vector.
    std::deque<std::size_t> height_additions;
    int index{0};
    auto to_distribute = height_left;
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->height_policy.type();
        if (policy == Size_policy::Expanding ||
            policy == Size_policy::MinimumExpanding) {
            height_additions.push_back((d.widget->height_policy.stretch() /
                                        static_cast<double>(total_stretch)) *
                                       to_distribute);
            if ((*d.height + height_additions.back()) >
                d.widget->height_policy.max_size()) {
                height_left += d.widget->height_policy.max_size() - *d.height;
                *d.height = d.widget->height_policy.max_size();
                widgets.erase(std::begin(widgets) + index);
                return distribute_space(widgets, height_left);
            }
        }
        ++index;
    }

    // If it has gotten this far, no widgets were over space, assign calculated
    // values
    for (Dimensions_reference& d : widgets) {
        auto policy = d.widget->height_policy.type();
        if (policy == Size_policy::Expanding ||
            policy == Size_policy::MinimumExpanding) {
            *d.height += height_additions.front();
            height_left -= height_additions.front();
            height_additions.pop_front();
        }
    }

    // SECOND GROUP - duplicate of above dependent on Policies to work with.
    // Preferred and Minimum
    if (height_left == 0) {
        return;
    }
    // Find total stretch
    total_stretch = 0;
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->height_policy.type();
        if (policy == Size_policy::Preferred ||
            policy == Size_policy::Minimum || policy == Size_policy::Ignored) {
            total_stretch += d.widget->height_policy.stretch();
        }
    }

    // Calculate new heights of widgets in new group, if any go over max_height
    // then assign max value and recurse without that widget in vector.
    height_additions.clear();
    index = 0;
    to_distribute = height_left;
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->height_policy.type();
        if (policy == Size_policy::Preferred ||
            policy == Size_policy::Minimum || policy == Size_policy::Ignored) {
            height_additions.push_back((d.widget->width_policy.stretch() /
                                        static_cast<double>(total_stretch)) *
                                       to_distribute);
            if ((*d.height + height_additions.back()) >
                d.widget->height_policy.max_size()) {
                height_left -= d.widget->height_policy.max_size() - *d.height;
                *d.height = d.widget->height_policy.max_size();
                widgets.erase(std::begin(widgets) + index);
                return distribute_space(widgets, height_left);
            }
        }
        ++index;
    }

    // If it has gotten this far, no widgets were over space, assign calculated
    // values
    for (Dimensions_reference& d : widgets) {
        auto policy = d.widget->height_policy.type();
        if (policy == Size_policy::Preferred ||
            policy == Size_policy::Minimum || policy == Size_policy::Ignored) {
            *d.height += height_additions.front();
            height_left -= height_additions.front();
            height_additions.pop_front();
        }
    }
    if (height_left == 0) {
        return;
    }
    // Rounding error extra
    // First Group
    auto height_check{0};
    do {
        height_check = height_left;
        for (Dimensions_reference& d : widgets) {
            auto policy = d.widget->height_policy.type();
            if ((policy == Size_policy::Expanding ||
                 policy == Size_policy::MinimumExpanding) &&
                height_left > 0) {
                if (*d.height + 1 <= d.widget->height_policy.max_size()) {
                    *d.height += 1;
                    height_left -= 1;
                }
            }
        }
    } while (height_check != height_left);

    // Second Group
    do {
        height_check = height_left;
        for (Dimensions_reference& d : widgets) {
            auto policy = d.widget->height_policy.type();
            if ((policy == Size_policy::Preferred ||
                 policy == Size_policy::Minimum ||
                 policy == Size_policy::Ignored) &&
                height_left > 0) {
                if (*d.height + 1 <= d.widget->height_policy.max_size()) {
                    *d.height += 1;
                    height_left -= 1;
                }
            }
        }
    } while (height_check != height_left);
}